

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O2

Int32 testing::internal::Int32FromGTestEnv(char *flag,Int32 default_value)

{
  bool bVar1;
  char *str;
  Int32 IVar2;
  Int32 result;
  string env_var;
  Int32 local_74;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_70;
  char *local_68 [2];
  char *in_stack_ffffffffffffffa8;
  string local_48;
  
  FlagToEnvVar_abi_cxx11_(in_stack_ffffffffffffffa8);
  str = getenv(local_68[0]);
  IVar2 = default_value;
  if (str != (char *)0x0) {
    local_74 = default_value;
    Message::Message((Message *)&local_48);
    std::operator<<((ostream *)(local_48._M_dataplus._M_p + 0x10),"Environment variable ");
    std::operator<<((ostream *)(local_48._M_dataplus._M_p + 0x10),(string *)local_68);
    bVar1 = ParseInt32((Message *)&local_48,str,&local_74);
    if ((long *)local_48._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_48._M_dataplus._M_p + 8))();
    }
    IVar2 = local_74;
    if (!bVar1) {
      Message::Message((Message *)&local_70);
      std::ostream::operator<<(local_70._M_head_impl + 0x10,default_value);
      StringStreamToString(&local_48,local_70._M_head_impl);
      printf("The default value %s is used.\n",local_48._M_dataplus._M_p);
      std::__cxx11::string::_M_dispose();
      if (local_70._M_head_impl != (stringstream *)0x0) {
        (**(code **)(*(long *)local_70._M_head_impl + 8))();
      }
      fflush(_stdout);
      IVar2 = default_value;
    }
  }
  std::__cxx11::string::_M_dispose();
  return IVar2;
}

Assistant:

Int32 Int32FromGTestEnv(const char* flag, Int32 default_value) {
#if defined(GTEST_GET_INT32_FROM_ENV_)
  return GTEST_GET_INT32_FROM_ENV_(flag, default_value);
#else
  const std::string env_var = FlagToEnvVar(flag);
  const char* const string_value = posix::GetEnv(env_var.c_str());
  if (string_value == nullptr) {
    // The environment variable is not set.
    return default_value;
  }

  Int32 result = default_value;
  if (!ParseInt32(Message() << "Environment variable " << env_var,
                  string_value, &result)) {
    printf("The default value %s is used.\n",
           (Message() << default_value).GetString().c_str());
    fflush(stdout);
    return default_value;
  }

  return result;
#endif  // defined(GTEST_GET_INT32_FROM_ENV_)
}